

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

void disas_crypto_aes(DisasContext_conflict1 *s,uint32_t insn)

{
  int32_t val;
  TCGContext_conflict1 *tcg_ctx;
  code *pcVar1;
  _Bool _Var2;
  uint uVar3;
  ulong uVar4;
  TCGv_ptr pTVar5;
  TCGv_ptr pTVar6;
  TCGv_i32 pTVar7;
  uintptr_t o;
  uintptr_t o_1;
  uintptr_t o_2;
  
  if ((((insn & 0xc00000) == 0) && ((s->isar->id_aa64isar0 & 0xf0) != 0)) &&
     (uVar3 = (insn >> 0xc & 0x1f) - 4, (ushort)uVar3 < 4)) {
    tcg_ctx = s->uc->tcg_ctx;
    uVar4 = (ulong)(uVar3 & 0xffff);
    val = *(int32_t *)(&DAT_00b86b24 + uVar4 * 4);
    pcVar1 = (code *)(&PTR_gen_helper_crypto_aese_00ec3220)[uVar4];
    _Var2 = fp_access_check(s);
    if (_Var2) {
      pTVar5 = vec_full_reg_ptr(s,insn & 0x1f);
      pTVar6 = vec_full_reg_ptr(s,insn >> 5 & 0x1f);
      pTVar7 = tcg_const_i32_aarch64(tcg_ctx,val);
      (*pcVar1)(tcg_ctx,pTVar5,pTVar6,pTVar7);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar5 + (long)tcg_ctx));
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar6 + (long)tcg_ctx));
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar7 + (long)tcg_ctx));
      return;
    }
    return;
  }
  unallocated_encoding_aarch64(s);
  return;
}

Assistant:

static void disas_crypto_aes(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int size = extract32(insn, 22, 2);
    int opcode = extract32(insn, 12, 5);
    int rn = extract32(insn, 5, 5);
    int rd = extract32(insn, 0, 5);
    int decrypt;
    TCGv_ptr tcg_rd_ptr, tcg_rn_ptr;
    TCGv_i32 tcg_decrypt;
    CryptoThreeOpIntFn *genfn;

    if (!dc_isar_feature(aa64_aes, s) || size != 0) {
        unallocated_encoding(s);
        return;
    }

    switch (opcode) {
    case 0x4: /* AESE */
        decrypt = 0;
        genfn = gen_helper_crypto_aese;
        break;
    case 0x6: /* AESMC */
        decrypt = 0;
        genfn = gen_helper_crypto_aesmc;
        break;
    case 0x5: /* AESD */
        decrypt = 1;
        genfn = gen_helper_crypto_aese;
        break;
    case 0x7: /* AESIMC */
        decrypt = 1;
        genfn = gen_helper_crypto_aesmc;
        break;
    default:
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    tcg_rd_ptr = vec_full_reg_ptr(s, rd);
    tcg_rn_ptr = vec_full_reg_ptr(s, rn);
    tcg_decrypt = tcg_const_i32(tcg_ctx, decrypt);

    genfn(tcg_ctx, tcg_rd_ptr, tcg_rn_ptr, tcg_decrypt);

    tcg_temp_free_ptr(tcg_ctx, tcg_rd_ptr);
    tcg_temp_free_ptr(tcg_ctx, tcg_rn_ptr);
    tcg_temp_free_i32(tcg_ctx, tcg_decrypt);
}